

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

UInt32 crnlib::LitEnc_GetPrice(UInt16 *probs,UInt32 symbol,UInt32 *ProbPrices)

{
  UInt32 local_24;
  UInt32 price;
  UInt32 *ProbPrices_local;
  UInt32 symbol_local;
  UInt16 *probs_local;
  
  local_24 = 0;
  ProbPrices_local._4_4_ = symbol | 0x100;
  do {
    local_24 = ProbPrices
               [(int)((uint)probs[ProbPrices_local._4_4_ >> 8] ^
                     -(ProbPrices_local._4_4_ >> 7 & 1) & 0x7ff) >> 4] + local_24;
    ProbPrices_local._4_4_ = ProbPrices_local._4_4_ << 1;
  } while (ProbPrices_local._4_4_ < 0x10000);
  return local_24;
}

Assistant:

static UInt32 LitEnc_GetPrice(const CLzmaProb* probs, UInt32 symbol, UInt32* ProbPrices) {
  UInt32 price = 0;
  symbol |= 0x100;
  do {
    price += GET_PRICEa(probs[symbol >> 8], (symbol >> 7) & 1);
    symbol <<= 1;
  } while (symbol < 0x10000);
  return price;
}